

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_cbc_mode.c
# Opt level: O0

int tc_cbc_mode_encrypt(uint8_t *out,uint outlen,uint8_t *in,uint inlen,uint8_t *iv,
                       TCAesKeySched_t sched)

{
  uint uVar1;
  uint local_60;
  uint local_5c;
  uint m;
  uint n;
  uint8_t buffer [16];
  TCAesKeySched_t sched_local;
  uint8_t *iv_local;
  byte *pbStack_28;
  uint inlen_local;
  uint8_t *in_local;
  EVP_PKEY_CTX *pEStack_18;
  uint outlen_local;
  uint8_t *out_local;
  
  if (((((out == (uint8_t *)0x0) || (in == (uint8_t *)0x0)) || (sched == (TCAesKeySched_t)0x0)) ||
      ((inlen == 0 || (outlen == 0)))) ||
     (((inlen & 0xf) != 0 || (((outlen & 0xf) != 0 || (outlen != inlen + 0x10)))))) {
    out_local._4_4_ = 0;
  }
  else {
    _copy((EVP_PKEY_CTX *)&m,(EVP_PKEY_CTX *)0x10);
    _copy((EVP_PKEY_CTX *)out,(EVP_PKEY_CTX *)0x10);
    pEStack_18 = (EVP_PKEY_CTX *)(out + 0x10);
    local_60 = 0;
    pbStack_28 = in;
    for (local_5c = 0; local_5c < inlen; local_5c = local_5c + 1) {
      uVar1 = local_60 + 1;
      *(byte *)((long)&m + (ulong)local_60) = *(byte *)((long)&m + (ulong)local_60) ^ *pbStack_28;
      local_60 = uVar1;
      if (uVar1 == 0x10) {
        tc_aes_encrypt((uint8_t *)&m,(uint8_t *)&m,sched);
        _copy(pEStack_18,(EVP_PKEY_CTX *)0x10);
        pEStack_18 = pEStack_18 + 0x10;
        local_60 = 0;
      }
      pbStack_28 = pbStack_28 + 1;
    }
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int tc_cbc_mode_encrypt(uint8_t *out, unsigned int outlen, const uint8_t *in,
			    unsigned int inlen, const uint8_t *iv,
			    const TCAesKeySched_t sched)
{

	uint8_t buffer[TC_AES_BLOCK_SIZE];
	unsigned int n, m;

	/* input sanity check: */
	if (out == (uint8_t *) 0 ||
	    in == (const uint8_t *) 0 ||
	    sched == (TCAesKeySched_t) 0 ||
	    inlen == 0 ||
	    outlen == 0 ||
	    (inlen % TC_AES_BLOCK_SIZE) != 0 ||
	    (outlen % TC_AES_BLOCK_SIZE) != 0 ||
	    outlen != inlen + TC_AES_BLOCK_SIZE) {
		return TC_CRYPTO_FAIL;
	}

	/* copy iv to the buffer */
	(void)_copy(buffer, TC_AES_BLOCK_SIZE, iv, TC_AES_BLOCK_SIZE);
	/* copy iv to the output buffer */
	(void)_copy(out, TC_AES_BLOCK_SIZE, iv, TC_AES_BLOCK_SIZE);
	out += TC_AES_BLOCK_SIZE;

	for (n = m = 0; n < inlen; ++n) {
		buffer[m++] ^= *in++;
		if (m == TC_AES_BLOCK_SIZE) {
			(void)tc_aes_encrypt(buffer, buffer, sched);
			(void)_copy(out, TC_AES_BLOCK_SIZE,
				    buffer, TC_AES_BLOCK_SIZE);
			out += TC_AES_BLOCK_SIZE;
			m = 0;
		}
	}

	return TC_CRYPTO_SUCCESS;
}